

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

void __thiscall SymbolTable::addGlobalSymbol(SymbolTable *this,SleighSymbol *a)

{
  uintm uVar1;
  size_type sVar2;
  SleighError *this_00;
  char local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  SymbolScope *local_28;
  SleighSymbol *res;
  SymbolScope *scope;
  SleighSymbol *a_local;
  SymbolTable *this_local;
  
  scope = (SymbolScope *)a;
  a_local = (SleighSymbol *)this;
  sVar2 = std::vector<SleighSymbol_*,_std::allocator<SleighSymbol_*>_>::size(&this->symbollist);
  *(int *)&(scope->tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (int)sVar2;
  std::vector<SleighSymbol_*,_std::allocator<SleighSymbol_*>_>::push_back
            (&this->symbollist,(value_type *)&scope);
  res = (SleighSymbol *)getGlobalScope(this);
  uVar1 = SymbolScope::getId((SymbolScope *)res);
  *(uintm *)((long)&(scope->tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 4) = uVar1
  ;
  local_28 = (SymbolScope *)SymbolScope::addSymbol((SymbolScope *)res,(SleighSymbol *)scope);
  if (local_28 != scope) {
    this_00 = (SleighError *)__cxa_allocate_exception(0x20);
    SleighSymbol::getName_abi_cxx11_((SleighSymbol *)scope);
    std::operator+(local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            "Duplicate symbol name \'");
    std::operator+(local_48,local_68);
    SleighError::SleighError(this_00,local_48);
    __cxa_throw(this_00,&SleighError::typeinfo,SleighError::~SleighError);
  }
  return;
}

Assistant:

void SymbolTable::addGlobalSymbol(SleighSymbol *a)

{
  a->id = symbollist.size();
  symbollist.push_back(a);
  SymbolScope *scope = getGlobalScope();
  a->scopeid = scope->getId();
  SleighSymbol *res = scope->addSymbol(a);
  if (res != a)
    throw SleighError("Duplicate symbol name '" + a->getName() + "'");
}